

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O1

void __thiscall
VcdGen::Signal::value_at
          (Signal *this,
          vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
          *tick_data)

{
  tuple<unsigned_long,_unsigned_int> *d;
  pointer ptVar1;
  _Tuple_impl<0UL,_unsigned_long,_unsigned_int> local_58;
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_48;
  
  get_tick_data();
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector(&local_48,tick_data);
  if (local_48.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ptVar1 = local_48.
             super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_58.super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
      _M_head_impl = (ptVar1->super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>).
                     super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>
      ;
      local_58._4_4_ =
           *(undefined4 *)&(ptVar1->super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>).field_0x4;
      local_58.super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           (ptVar1->super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>).
           super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      TickData::append(&get_tick_data::tick_data,(tuple<unsigned_long,_unsigned_int> *)&local_58,
                       this);
      ptVar1 = ptVar1 + 1;
    } while (ptVar1 != local_48.
                       super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_48.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void value_at( vector<tuple<uint64_t, uint32_t>> tick_data ){
        TickData& data = get_tick_data();
        data.append(tick_data, this);
    }